

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_get_body(nng_http *conn,void **datap,size_t *sizep)

{
  size_t *sizep_local;
  void **datap_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    *datap = (conn->req).data.data;
    *sizep = (conn->req).data.size;
  }
  else {
    *datap = (conn->res).data.data;
    *sizep = (conn->res).data.size;
  }
  return;
}

Assistant:

void
nni_http_get_body(nng_http *conn, void **datap, size_t *sizep)
{
	if (conn->client) {
		*datap = conn->res.data.data;
		*sizep = conn->res.data.size;
	} else {
		*datap = conn->req.data.data;
		*sizep = conn->req.data.size;
	}
}